

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O2

material_table * __thiscall material_table::operator=(material_table *this,material_table *o)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  size_t sVar3;
  material_entry *__p;
  material_entry *pmVar4;
  ulong uVar5;
  __shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  uVar1 = this->count;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar1;
  uVar5 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0x28),8) == 0) {
    uVar5 = SUB168(auVar2 * ZEXT816(0x28),0);
  }
  __p = (material_entry *)operator_new__(uVar5);
  if (uVar1 != 0) {
    pmVar4 = __p;
    do {
      pmVar4->endgame_coeff = 0.0;
      pmVar4->endgame = KpK;
      pmVar4->number[0] = '\0';
      pmVar4->number[1] = '\0';
      pmVar4->number[2] = '\0';
      pmVar4->number[3] = '\0';
      *(undefined8 *)(pmVar4->number + 4) = 0;
      pmVar4->key = 0;
      *(undefined8 *)&pmVar4->score = 0;
      pmVar4->endgame = none;
      pmVar4 = pmVar4 + 1;
    } while (pmVar4 != __p + uVar1);
  }
  std::__shared_ptr<material_entry[],(__gnu_cxx::_Lock_policy)2>::__shared_ptr<material_entry,void>
            ((__shared_ptr<material_entry[],(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,__p);
  std::__shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->entries).super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  memcpy((this->entries).super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         (o->entries).super___shared_ptr<material_entry[],_(__gnu_cxx::_Lock_policy)2>._M_ptr,
         this->count * 0x28);
  sVar3 = o->count;
  this->sz_mb = o->sz_mb;
  this->count = sVar3;
  return this;
}

Assistant:

material_table& material_table::operator=(const material_table& o) {
	entries = std::shared_ptr<material_entry[]>(new material_entry[count]());
	std::memcpy(entries.get(), o.entries.get(), count * sizeof(material_entry));
	sz_mb = o.sz_mb;
	count = o.count;
	return *this;
}